

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::DecomposeAffine(ON_Xform *this,ON_3dVector *T,ON_Xform *L)

{
  bool bVar1;
  long lVar2;
  ON_Xform *pOVar3;
  byte bVar4;
  ON_3dVector local_40;
  
  bVar4 = 0;
  bVar1 = IsAffine(this);
  if (bVar1) {
    ON_3dVector::ON_3dVector(&local_40,this->m_xform[0][3],this->m_xform[1][3],this->m_xform[2][3]);
    T->z = local_40.z;
    T->x = local_40.x;
    T->y = local_40.y;
    pOVar3 = L;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar3->m_xform[0][0] = this->m_xform[0][0];
      this = (ON_Xform *)((long)this + ((ulong)bVar4 * -2 + 1) * 8);
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar4 * -2 + 1) * 8);
    }
    L->m_xform[2][3] = 0.0;
    L->m_xform[1][3] = 0.0;
    L->m_xform[0][3] = 0.0;
  }
  return bVar1;
}

Assistant:

bool ON_Xform::DecomposeAffine(ON_3dVector& T, ON_Xform& L) const
{
	bool rc = IsAffine();
	if (rc)
	{
		T = ON_3dVector(m_xform[0][3], m_xform[1][3], m_xform[2][3]);
		L = (*this);
		L.m_xform[0][3] = L.m_xform[1][3] = L.m_xform[2][3] = 0.0;
	}
	return rc;
}